

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O3

TBasicType glslang::getCorrespondingUnsignedType(TBasicType type)

{
  uint uVar1;
  
  uVar1 = type - EbtInt8;
  if ((uVar1 < 7) && ((0x55U >> (uVar1 & 0x1f) & 1) != 0)) {
    return *(TBasicType *)(&DAT_008886e4 + (ulong)uVar1 * 4);
  }
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/Intermediate.cpp"
                ,0x67c,"TBasicType glslang::getCorrespondingUnsignedType(TBasicType)");
}

Assistant:

static TBasicType getCorrespondingUnsignedType(TBasicType type)
{
    switch(type) {
    case EbtInt8:
        return EbtUint8;
    case EbtInt16:
        return EbtUint16;
    case EbtInt:
        return EbtUint;
    case EbtInt64:
        return EbtUint64;
    default:
        assert(false);
        return EbtNumTypes;
    }
}